

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O0

void __thiscall
supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>::add
          (BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long> *this,Key<3UL> *key,
          ByteArray<4UL> *value)

{
  ByteArray<4UL> *in_RDX;
  ByteArray<4UL> *in_RSI;
  
  std::
  map<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_std::less<supermap::Key<3UL>_>,_std::allocator<std::pair<const_supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>_>
  ::operator[]((map<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_std::less<supermap::Key<3UL>_>,_std::allocator<std::pair<const_supermap::Key<3UL>,_supermap::ByteArray<4UL>_>_>_>
                *)this,key);
  ByteArray<4UL>::operator=(in_RSI,in_RDX);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        map_[key] = std::move(value);
    }